

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O3

void controlbitsfrompermutation(int w,int n,int step,int off,uchar *c,uint32_t *pi)

{
  uint32_t *puVar1;
  uchar *puVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  uint32_t *puVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  int iVar11;
  int iVar12;
  undefined4 in_register_00000034;
  long lVar13;
  undefined4 in_register_0000003c;
  uint32_t *puVar14;
  uint32_t *pi_00;
  uint32_t *x;
  bool bVar15;
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  uint uVar22;
  uint uVar24;
  uint uVar25;
  undefined1 auVar23 [16];
  uint uVar26;
  undefined1 auVar27 [16];
  uint32_t auStack_a0 [2];
  undefined8 local_98;
  undefined8 local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  undefined8 local_70;
  long local_68;
  uint32_t *local_60;
  ulong local_58;
  uint32_t *local_50;
  uchar *local_48;
  ulong local_40;
  undefined8 local_38;
  long lVar20;
  
  local_40 = CONCAT44(in_register_0000003c,w);
  local_38 = CONCAT44(in_register_00000034,n);
  local_70 = CONCAT44(in_register_00000014,step);
  local_78 = (ulong)(uint)off;
  uVar5 = (ulong)(uint)n;
  uVar4 = uVar5 * 4 + 0xf & 0xfffffffffffffff0;
  lVar13 = -uVar4;
  puVar14 = (uint32_t *)((long)&local_98 + lVar13);
  local_58 = (ulong)(uint)(n * 2);
  uVar8 = local_58 * 4 + 0xf & 0xfffffffffffffff0;
  local_60 = (uint32_t *)((long)puVar14 - uVar8);
  x = (uint32_t *)((long)local_60 - uVar8);
  local_90 = (uint32_t *)((long)x - uVar8);
  pi_00 = (uint32_t *)((long)local_90 - uVar8);
  local_68 = (long)pi_00 - uVar4;
  local_80 = (ulong)(uint)(n / 2);
  puVar9 = (uint32_t *)(local_68 - (local_80 * 8 + 0xf & 0xfffffffffffffff0));
  if (w == 1) {
    iVar7 = off + 7;
    if (-1 < off) {
      iVar7 = off;
    }
    c[iVar7 >> 3] = c[iVar7 >> 3] | (byte)((*pi & 1) << ((byte)off & 7));
  }
  else if (1 < w) {
    local_50 = puVar9;
    local_48 = c;
    if (n < 1) {
      puVar9[-2] = 0x1031a8;
      puVar9[-1] = 0;
      composeinv(n,puVar14,puVar14,pi);
      uVar4 = local_40;
    }
    else {
      lVar20 = uVar5 - 1;
      auVar16._8_4_ = (int)lVar20;
      auVar16._0_8_ = lVar20;
      auVar16._12_4_ = (int)((ulong)lVar20 >> 0x20);
      uVar4 = 0;
      auVar16 = auVar16 ^ _DAT_00107230;
      auVar19 = _DAT_00107170;
      do {
        auVar23 = auVar19 ^ _DAT_00107230;
        if ((bool)(~(auVar23._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar23._0_4_ ||
                    auVar16._4_4_ < auVar23._4_4_) & 1)) {
          puVar14[uVar4] = (uint32_t)uVar4;
        }
        if ((auVar23._12_4_ != auVar16._12_4_ || auVar23._8_4_ <= auVar16._8_4_) &&
            auVar23._12_4_ <= auVar16._12_4_) {
          *(uint32_t *)((long)&local_98 + uVar4 * 4 + lVar13 + 4) = (uint32_t)uVar4 + 1;
        }
        uVar4 = uVar4 + 2;
        lVar20 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 2;
        auVar19._8_8_ = lVar20 + 2;
      } while ((n + 1U & 0xfffffffe) != uVar4);
      puVar9[-2] = 0x102fbb;
      puVar9[-1] = 0;
      composeinv(n,puVar14,puVar14,pi);
      uVar4 = local_40;
      auVar19 = _DAT_00107230;
      if (0 < (int)local_38) {
        uVar8 = 0;
        do {
          local_60[uVar8] = puVar14[uVar8] | 1 << ((byte)local_40 & 0x1f);
          local_60[uVar5 + uVar8] = pi[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        if (0 < (int)local_38) {
          uVar8 = 1;
          if (1 < (int)local_58) {
            uVar8 = local_58 & 0xffffffff;
          }
          uVar10 = (1 << ((byte)local_40 & 0x1f)) - 2;
          lVar13 = uVar8 - 1;
          auVar17._8_4_ = (int)lVar13;
          auVar17._0_8_ = lVar13;
          auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
          iVar7 = (int)local_40;
          uVar22 = 0;
          uVar24 = 1;
          uVar25 = 2;
          uVar26 = 3;
          lVar13 = 0;
          auVar17 = auVar17 ^ auVar19;
          auVar27._4_12_ = SUB1612((undefined1  [16])0x0,4);
          auVar27._0_4_ = iVar7;
          auVar23 = _DAT_001072a0;
          auVar21 = _DAT_00107170;
          do {
            auVar16 = auVar21 ^ auVar19;
            iVar18 = auVar17._4_4_;
            lVar20 = auVar27._0_8_;
            if ((bool)(~(auVar16._4_4_ == iVar18 && auVar17._0_4_ < auVar16._0_4_ ||
                        iVar18 < auVar16._4_4_) & 1)) {
              *(uint *)((long)x + lVar13) = (0 << iVar7) + (uVar10 & uVar22) + (uVar22 >> lVar20);
            }
            if ((auVar16._12_4_ != auVar17._12_4_ || auVar16._8_4_ <= auVar17._8_4_) &&
                auVar16._12_4_ <= auVar17._12_4_) {
              *(uint *)((long)x + lVar13 + 4) =
                   (uVar24 & 1) + (uVar10 & uVar24) + (uVar24 >> lVar20);
            }
            iVar12 = SUB164(auVar23 ^ auVar19,4);
            if (iVar12 <= iVar18 &&
                (iVar12 != iVar18 || SUB164(auVar23 ^ auVar19,0) <= auVar17._0_4_)) {
              *(uint *)((long)x + lVar13 + 8) = (uVar10 & uVar25) + (uVar25 >> lVar20);
              *(uint *)((long)x + lVar13 + 0xc) =
                   (uVar26 & 1) + (uVar10 & uVar26) + (uVar26 >> lVar20);
            }
            lVar20 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 4;
            auVar21._8_8_ = lVar20 + 4;
            lVar20 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 4;
            auVar23._8_8_ = lVar20 + 4;
            uVar22 = uVar22 + 4;
            uVar24 = uVar24 + 4;
            uVar25 = uVar25 + 4;
            uVar26 = uVar26 + 4;
            lVar13 = lVar13 + 0x10;
          } while ((ulong)((int)uVar8 + 3U & 0xfffffffc) << 2 != lVar13);
        }
      }
    }
    uVar10 = ~(-1 << ((byte)uVar4 & 0x1f));
    uVar4 = 1;
    if (1 < (int)local_58) {
      uVar4 = local_58 & 0xffffffff;
    }
    uVar22 = 0;
    local_98 = pi;
    local_88 = uVar5;
    do {
      while( true ) {
        uVar5 = local_58;
        puVar1 = local_60;
        puVar14 = local_90;
        puVar9[-2] = 0x1031ed;
        puVar9[-1] = 0;
        composeinv((int)uVar5,puVar14,x,puVar1);
        uVar5 = local_40;
        puVar14 = local_90;
        iVar7 = (int)local_38;
        if (iVar7 < 1) break;
        uVar8 = 0;
        do {
          bVar15 = (puVar14[uVar8] & uVar10) < (x[uVar8] & uVar10);
          uVar24 = x[uVar8];
          if (bVar15) {
            uVar24 = puVar14[uVar8];
          }
          x[uVar8] = (uint)(bVar15 && uVar22 != 0) << ((byte)uVar5 & 0x1f) ^ uVar24;
          puVar1 = local_60;
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
        if (iVar7 < 1) break;
        uVar5 = 0;
        do {
          pi_00[uVar5] = puVar1[uVar5 ^ 1];
          uVar8 = local_58;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
        puVar9[-2] = 0x103276;
        puVar9[-1] = 0;
        composeinv((int)uVar8,puVar1,puVar1,pi_00);
        uVar5 = local_40;
        uVar24 = (uint)local_40;
        if ((int)local_38 < 1) goto LAB_001032fd;
        uVar8 = 0;
        do {
          pi_00[uVar8] = x[uVar8 ^ 1];
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
        if ((int)local_38 < 1) goto LAB_001032fd;
        uVar8 = 0;
        do {
          bVar15 = (pi_00[uVar8] & uVar10) < (x[uVar8] & uVar10);
          uVar25 = x[uVar8];
          if (bVar15) {
            uVar25 = pi_00[uVar8];
          }
          x[uVar8] = (uint)bVar15 << ((byte)uVar5 & 0x1f) ^ uVar25;
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
        uVar22 = uVar22 + 1;
        if (uVar22 == uVar24) {
          if (0 < (int)local_38) {
            uVar4 = 0;
            iVar18 = (int)local_78;
            iVar7 = (int)local_70;
            do {
              *(uint32_t *)(local_68 + uVar4 * 4) = local_98[uVar4];
              uVar4 = uVar4 + 1;
            } while (local_88 != uVar4);
            bVar15 = (int)local_38 != 1;
            if ((int)local_38 == 1) {
LAB_001034d6:
              bVar15 = false;
            }
            else {
              uVar4 = 0;
              uVar8 = local_78 & 0xffffffff;
              do {
                iVar11 = (int)uVar8;
                iVar12 = iVar11 + 7;
                if (-1 < iVar11) {
                  iVar12 = iVar11;
                }
                local_48[iVar12 >> 3] =
                     local_48[iVar12 >> 3] |
                     ((x[uVar4 * 2] >> (uVar24 & 0x1f) & 1) != 0) << ((byte)uVar8 & 7);
                uVar4 = uVar4 + 1;
                uVar8 = (ulong)(uint)(iVar11 + iVar7);
              } while (local_80 != uVar4);
              if ((int)local_38 == 1) goto LAB_001034d6;
              iVar12 = iVar7 * (int)local_38 * (uVar24 - 1) + iVar18;
              uVar4 = 0;
              do {
                iVar11 = iVar12 + 7;
                if (-1 < iVar12) {
                  iVar11 = iVar12;
                }
                local_48[iVar11 >> 3] =
                     local_48[iVar11 >> 3] |
                     ((x[local_88 + uVar4 * 2] >> (uVar24 & 0x1f) & 1) != 0) << ((byte)iVar12 & 7);
                uVar4 = uVar4 + 1;
                iVar12 = iVar12 + iVar7;
              } while (local_80 != uVar4);
              if ((int)local_38 == 1) {
                bVar15 = false;
              }
              else {
                uVar4 = 0;
                do {
                  uVar10 = *(uint *)(local_68 + uVar4 * 8);
                  uVar22 = *(uint *)(local_68 + 4 + uVar4 * 8);
                  uVar25 = x[local_88 + uVar4 * 2] & 1 << ((byte)uVar5 & 0x1f);
                  if (uVar25 != 0) {
                    uVar25 = uVar22 ^ uVar10;
                  }
                  *(uint *)(local_68 + uVar4 * 8) = uVar10 ^ uVar25;
                  *(uint *)(local_68 + 4 + uVar4 * 8) = uVar25 ^ uVar22;
                  uVar4 = uVar4 + 1;
                } while (local_80 != uVar4);
              }
            }
            goto LAB_00103322;
          }
          goto LAB_00103308;
        }
      }
      uVar5 = local_58;
      puVar14 = local_60;
      puVar9[-2] = 0x1032f9;
      puVar9[-1] = 0;
      composeinv((int)uVar5,puVar14,puVar14,pi_00);
      uVar24 = (uint)local_40;
LAB_001032fd:
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar24);
LAB_00103308:
    bVar15 = false;
    iVar18 = (int)local_78;
    iVar7 = (int)local_70;
LAB_00103322:
    puVar2 = local_48;
    puVar14 = local_50;
    uVar5 = local_80;
    lVar13 = 0;
    bVar3 = true;
    do {
      bVar6 = bVar3;
      if (bVar15) {
        uVar4 = 0;
        do {
          local_50[lVar13 * local_80 + uVar4] = *(uint *)(local_68 + lVar13 * 4 + uVar4 * 8) >> 1;
          uVar4 = uVar4 + 1;
        } while (local_80 != uVar4);
      }
      lVar13 = 1;
      bVar3 = false;
    } while (bVar6);
    local_40 = (ulong)(uVar24 - 1);
    iVar12 = (int)local_80;
    puVar9[-2] = 0x103380;
    puVar9[-1] = 0;
    controlbitsfrompermutation(uVar24 - 1,iVar12,iVar7 * 2,iVar12 * iVar7 + iVar18,puVar2,puVar14);
    uVar4 = local_40;
    puVar2 = local_48;
    puVar9[-2] = 0x1033a2;
    puVar9[-1] = 0;
    controlbitsfrompermutation
              ((int)uVar4,iVar12,iVar7 * 2,(iVar12 + 1) * iVar7 + iVar18,puVar2,puVar14 + uVar5);
  }
  return;
}

Assistant:

static void controlbitsfrompermutation(int w, int n, int step, int off, unsigned char *c, uint32_t pi[n])
{
  int i;
  int j;
  int k;
  int t;
  uint32_t ip[n];
  uint32_t I[2 * n];
  uint32_t P[2 * n];
  uint32_t PI[2 * n];
  uint32_t T[2 * n];
  uint32_t piflip[n];
  uint32_t subpi[2][n / 2];

  if (w == 1) c[ off/8 ] |= (pi[0] & 1) << (off%8);
  if (w <= 1) return;

  invert(n,ip,pi);

  for (i = 0;i < n;++i) 
  {
    I[i] = ip[i] | (1 << w);
    I[n + i] = pi[i];
  }

  for (i = 0;i < 2 * n;++i)
      P[i] = (i >> w) + (i & ((1<<w)-2)) + ((i & 1) << w);

  for (t = 0;t < w;++t) 
  {
    composeinv(2 * n,PI,P,I);

    for (i = 0;i < 2 * n;++i)
      flow(w,&P[i],&PI[i],t);

    for (i = 0;i < 2 * n;++i)
	T[i] = I[i ^ 1];

    composeinv(2 * n,I,I,T);

    for (i = 0;i < 2 * n;++i)
	T[i] = P[i ^ 1];

    for (i = 0;i < 2 * n;++i)
      flow(w,&P[i],&T[i],1);
  }

  for (i = 0;i < n;++i)
    for (j = 0;j < w;++j)
      piflip[i] = pi[i];

  for (i = 0;i < n / 2;++i) c[ (off + i * step)/8 ] |= ((P[i * 2] >> w) & 1) << ((off + i * step)%8);
  for (i = 0;i < n / 2;++i) c[ (off + ((w-1)*n + i) * step)/8 ] |= ((P[n + i * 2] >> w) & 1) << ((off + ((w-1)*n + i) * step)%8);

  for (i = 0;i < n / 2;++i)
    cswap(&piflip[i * 2], &piflip[i * 2 + 1], (P[n + i * 2] >> w) & 1);

  for (k = 0;k < 2;++k)
    for (i = 0;i < n / 2;++i)
        subpi[k][i] = piflip[i * 2 + k] >> 1;

  for (k = 0;k < 2;++k)
    controlbitsfrompermutation(w - 1, n / 2, step * 2, off + step * (n/2 + k), c, subpi[k]);
}